

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall soinn::ESOINN::classify(ESOINN *this)

{
  int iVar1;
  bool bVar2;
  value_type vVar3;
  reference ppvVar4;
  int *piVar5;
  vertex_bundled *pvVar6;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> pVar7;
  vertex_descriptor local_a8;
  vertex_descriptor v_1;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> bgl_range_440;
  associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>
  local_70;
  associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>
  componentMap;
  ComponentMap component;
  void *local_30;
  vertex_descriptor v;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> bgl_range_433;
  size_t index;
  ESOINN *this_local;
  
  deleteNoiseVertex(this);
  bgl_range_433.second._M_node = (_List_node_base *)0x0;
  _v = boost::
       vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                 ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                   *)&this->graph);
  while (bVar2 = std::operator!=((_Self *)&v,&bgl_range_433.first), bVar2) {
    while (bVar2 = std::operator!=((_Self *)&v,&bgl_range_433.first), bVar2) {
      ppvVar4 = std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)&v);
      local_30 = *ppvVar4;
      component._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)bgl_range_433.second._M_node;
      bgl_range_433.second._M_node =
           (_List_node_base *)((long)&(bgl_range_433.second._M_node)->_M_next + 1);
      boost::
      put<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>,boost::vertex_index_t,void*,unsigned_long>
                (vertex_index,
                 (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                  *)&this->graph,&local_30,
                 &component._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_List_iterator<void_*>::operator++((_List_iterator<void_*> *)&v);
    }
    v = bgl_range_433.first._M_node;
  }
  std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>::map
            ((map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_> *)
             &componentMap);
  boost::
  associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>
  ::associative_property_map
            (&local_70,
             (map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_> *)
             &componentMap);
  vVar3 = boost::
          connected_components<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::associative_property_map<std::map<void*,int,std::less<void*>,std::allocator<std::pair<void*const,int>>>>>
                    (&this->graph,local_70.m_c);
  this->numberOfClasses = vVar3;
  pVar7 = boost::
          vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                      *)&this->graph);
  while( true ) {
    bgl_range_440.first = pVar7.second._M_node;
    v_1 = (vertex_descriptor)pVar7.first._M_node;
    bVar2 = std::operator!=((_Self *)&v_1,&bgl_range_440.first);
    if (!bVar2) break;
    while (bVar2 = std::operator!=((_Self *)&v_1,&bgl_range_440.first), bVar2) {
      ppvVar4 = std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)&v_1);
      local_a8 = *ppvVar4;
      piVar5 = boost::
               get<boost::associative_property_map<std::map<void*,int,std::less<void*>,std::allocator<std::pair<void*const,int>>>>,int&,void*>
                         ((put_get_helper<int_&,_boost::associative_property_map<std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>_>_>
                           *)&local_70,&local_a8);
      iVar1 = *piVar5;
      pvVar6 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,local_a8);
      pvVar6->classId = iVar1;
      std::_List_iterator<void_*>::operator++((_List_iterator<void_*> *)&v_1);
    }
    pVar7.second._M_node = bgl_range_440.first._M_node;
    pVar7.first._M_node = bgl_range_440.first._M_node;
  }
  std::map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>::~map
            ((map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_> *)
             &componentMap);
  return;
}

Assistant:

void ESOINN::classify()
{
    deleteNoiseVertex();
    size_t index = 0;
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        boost::put(boost::vertex_index, graph, v, index++);
    }
    ComponentMap component;
    boost::associative_property_map<ComponentMap> componentMap(component);
    numberOfClasses = connected_components(graph, componentMap);
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        graph[v].classId = boost::get(componentMap, v);
    }
}